

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

FileDescriptorSet * __thiscall
google::protobuf::FileDescriptorSet::New(FileDescriptorSet *this,Arena *arena)

{
  FileDescriptorSet *this_00;
  
  this_00 = (FileDescriptorSet *)operator_new(0x30);
  FileDescriptorSet(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::FileDescriptorSet>(arena,this_00);
  }
  return this_00;
}

Assistant:

FileDescriptorSet* FileDescriptorSet::New(::google::protobuf::Arena* arena) const {
  FileDescriptorSet* n = new FileDescriptorSet;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}